

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_nav2D.cpp
# Opt level: O1

EnvNAV2DHashEntry_t * __thiscall EnvironmentNAV2D::GetHashEntry(EnvironmentNAV2D *this,int X,int Y)

{
  vector<ENVHASHENTRY_*,_std::allocator<ENVHASHENTRY_*>_> *pvVar1;
  pointer ppEVar2;
  EnvNAV2DHashEntry_t *pEVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  iVar4 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x31])();
  pvVar1 = (this->EnvNAV2D).Coord2StateIDHashTable;
  ppEVar2 = pvVar1[iVar4].super__Vector_base<ENVHASHENTRY_*,_std::allocator<ENVHASHENTRY_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar5 = (uint)((ulong)((long)pvVar1[iVar4].
                               super__Vector_base<ENVHASHENTRY_*,_std::allocator<ENVHASHENTRY_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2) >> 3);
  if (0 < (int)uVar5) {
    uVar6 = 0;
    do {
      pEVar3 = ppEVar2[uVar6];
      if ((pEVar3->X == X) && (pEVar3->Y == Y)) {
        return pEVar3;
      }
      uVar6 = uVar6 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar6);
  }
  return (EnvNAV2DHashEntry_t *)0x0;
}

Assistant:

EnvNAV2DHashEntry_t* EnvironmentNAV2D::GetHashEntry(int X, int Y)
{
#if TIME_DEBUG
    clock_t currenttime = clock();
#endif

    int binid = GETHASHBIN(X, Y);

#if DEBUG
    if ((int)EnvNAV2D.Coord2StateIDHashTable[binid].size() > 500) {
        SBPL_PRINTF("WARNING: Hash table has a bin %d (X=%d Y=%d) of size %u\n",
                    binid, X, Y, (unsigned)EnvNAV2D.Coord2StateIDHashTable[binid].size());

        PrintHashTableHist();
    }
#endif

    //iterate over the states in the bin and select the perfect match
    for (int ind = 0; ind < (int)EnvNAV2D.Coord2StateIDHashTable[binid].size(); ind++) {
        if (EnvNAV2D.Coord2StateIDHashTable[binid][ind]->X == X &&
            EnvNAV2D.Coord2StateIDHashTable[binid][ind]->Y == Y)
        {
#if TIME_DEBUG
            time_gethash += clock()-currenttime;
#endif
            return EnvNAV2D.Coord2StateIDHashTable[binid][ind];
        }
    }

#if TIME_DEBUG
    time_gethash += clock()-currenttime;
#endif

    return NULL;
}